

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomx.cpp
# Opt level: O0

randomx_cache * randomx_alloc_cache(randomx_flags flags)

{
  randomx_flags rVar1;
  randomx_argon2_impl *prVar2;
  void *__s;
  randomx_cache *prVar3;
  randomx_flags in_EDI;
  exception *ex;
  randomx_argon2_impl *impl;
  randomx_cache *cache;
  randomx_flags in_stack_ffffffffffffff6c;
  randomx_cache *in_stack_ffffffffffffff70;
  
  prVar2 = randomx::selectArgonImpl(in_stack_ffffffffffffff6c);
  if (prVar2 == (randomx_argon2_impl *)0x0) {
    return (randomx_cache *)0x0;
  }
  __s = operator_new(0x83a8);
  memset(__s,0,0x83a8);
  randomx_cache::randomx_cache(in_stack_ffffffffffffff70);
  *(randomx_argon2_impl **)((long)__s + 0x83a0) = prVar2;
  rVar1 = operator|(RANDOMX_FLAG_JIT,RANDOMX_FLAG_LARGE_PAGES);
  rVar1 = operator&(in_EDI,rVar1);
  prVar3 = (randomx_cache *)
           (*(code *)(&DAT_001597b0 + *(int *)(&DAT_001597b0 + (ulong)rVar1 * 4)))();
  return prVar3;
}

Assistant:

randomx_cache *randomx_alloc_cache(randomx_flags flags) {
		randomx_cache *cache = nullptr;
		auto impl = randomx::selectArgonImpl(flags);
		if (impl == nullptr) {
			return cache;
		}

		try {
			cache = new randomx_cache();
			cache->argonImpl = impl;
			switch ((int)(flags & (RANDOMX_FLAG_JIT | RANDOMX_FLAG_LARGE_PAGES))) {
				case RANDOMX_FLAG_DEFAULT:
					cache->dealloc = &randomx::deallocCache<randomx::DefaultAllocator>;
					cache->jit = nullptr;
					cache->initialize = &randomx::initCache;
					cache->datasetInit = &randomx::initDataset;
					cache->memory = (uint8_t*)randomx::DefaultAllocator::allocMemory(randomx::CacheSize);
					break;

				case RANDOMX_FLAG_JIT:
					cache->dealloc = &randomx::deallocCache<randomx::DefaultAllocator>;
					cache->jit = new randomx::JitCompiler();
					cache->initialize = &randomx::initCacheCompile;
					cache->datasetInit = cache->jit->getDatasetInitFunc();
					cache->memory = (uint8_t*)randomx::DefaultAllocator::allocMemory(randomx::CacheSize);
					break;

				case RANDOMX_FLAG_LARGE_PAGES:
					cache->dealloc = &randomx::deallocCache<randomx::LargePageAllocator>;
					cache->jit = nullptr;
					cache->initialize = &randomx::initCache;
					cache->datasetInit = &randomx::initDataset;
					cache->memory = (uint8_t*)randomx::LargePageAllocator::allocMemory(randomx::CacheSize);
					break;

				case RANDOMX_FLAG_JIT | RANDOMX_FLAG_LARGE_PAGES:
					cache->dealloc = &randomx::deallocCache<randomx::LargePageAllocator>;
					cache->jit = new randomx::JitCompiler();
					cache->initialize = &randomx::initCacheCompile;
					cache->datasetInit = cache->jit->getDatasetInitFunc();
					cache->memory = (uint8_t*)randomx::LargePageAllocator::allocMemory(randomx::CacheSize);
					break;

				default:
					UNREACHABLE;
			}
		}
		catch (std::exception &ex) {
			if (cache != nullptr) {
				randomx_release_cache(cache);
				cache = nullptr;
			}
		}

		return cache;
	}